

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O0

void __thiscall
AllocationPolicyManager::AllocationPolicyManager
          (AllocationPolicyManager *this,bool needConcurrencySupport)

{
  Number limitMB;
  bool needConcurrencySupport_local;
  AllocationPolicyManager *this_local;
  
  this->memoryLimit = 0xffffffffffffffff;
  this->currentMemory = 0;
  this->supportConcurrency = needConcurrencySupport;
  CriticalSection::CriticalSection(&this->cs,0);
  this->context = (void *)0x0;
  this->memoryAllocationCallback = (PageAllocatorMemoryAllocationCallback)0x0;
  if (0 < _DAT_01ebe7b0) {
    this->memoryLimit = (long)_DAT_01ebe7b0 << 0x14;
  }
  return;
}

Assistant:

AllocationPolicyManager(bool needConcurrencySupport) :
        memoryLimit((size_t)-1),
        currentMemory(0),
        supportConcurrency(needConcurrencySupport),
        context(NULL),
        memoryAllocationCallback(NULL)
    {
        Js::Number limitMB = Js::Configuration::Global.flags.AllocPolicyLimit;
        if (limitMB > 0)
        {
            memoryLimit = (size_t)limitMB * 1024 * 1024;
        }
    }